

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Encoding EVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  const_pointer pcVar8;
  Options *this;
  long *plVar9;
  size_type sVar10;
  StringPiece *local_1c8;
  int local_1b8;
  Rune local_1b4;
  int n;
  Rune r;
  long local_1a8 [3];
  StringPiece local_190;
  int local_17c;
  undefined1 local_178 [4];
  int count;
  string out;
  char *lastend;
  char *ep;
  char *p;
  undefined1 local_138 [4];
  int nvec;
  StringPiece vec [17];
  StringPiece *rewrite_local;
  RE2 *re_local;
  string *str_local;
  
  local_1c8 = (StringPiece *)local_138;
  vec[0x10].size_ = (size_type)rewrite;
  do {
    StringPiece::StringPiece(local_1c8);
    local_1c8 = local_1c8 + 1;
  } while (local_1c8 != (StringPiece *)&vec[0x10].size_);
  iVar2 = MaxSubmatch((StringPiece *)vec[0x10].size_);
  iVar2 = iVar2 + 1;
  iVar3 = NumberOfCapturingGroups(re);
  if ((iVar3 + 1 < iVar2) || (0x11 < iVar2)) {
    return 0;
  }
  ep = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
  pcVar6 = ep + sVar5;
  out.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_178);
  local_17c = 0;
LAB_0033f2fa:
  do {
    if ((pcVar6 < ep) ||
       ((maximum_global_replace_count != -1 && (maximum_global_replace_count <= local_17c)))) {
LAB_0033f6e0:
      if (local_17c == 0) {
        str_local._4_4_ = 0;
      }
      else {
        if (ep < pcVar6) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,ep,
                 (long)pcVar6 - (long)ep);
        }
        std::swap<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   str);
        str_local._4_4_ = local_17c;
      }
      std::__cxx11::string::~string((string *)local_178);
      return str_local._4_4_;
    }
    StringPiece::StringPiece(&local_190,(string *)str);
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
    bVar1 = Match(re,&local_190,(long)ep - (long)pcVar7,sVar5,UNANCHORED,(StringPiece *)local_138,
                  iVar2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0033f6e0;
    pcVar8 = StringPiece::data((StringPiece *)local_138);
    if (ep < pcVar8) {
      pcVar8 = StringPiece::data((StringPiece *)local_138);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,ep,
                 (long)pcVar8 - (long)ep);
    }
    pcVar8 = StringPiece::data((StringPiece *)local_138);
    if ((pcVar8 == (const_pointer)out.field_2._8_8_) &&
       (bVar1 = StringPiece::empty((StringPiece *)local_138), bVar1)) {
      this = options(re);
      EVar4 = Options::encoding(this);
      bVar1 = false;
      if (EVar4 == EncodingUTF8) {
        local_1a8[0] = 4;
        _n = (long)pcVar6 - (long)ep;
        plVar9 = std::min<long>(local_1a8,(long *)&n);
        iVar3 = fullrune(ep,(int)*plVar9);
        bVar1 = iVar3 != 0;
      }
      if (bVar1) {
        local_1b8 = chartorune(&local_1b4,ep);
        if (0x10ffff < local_1b4) {
          local_1b8 = 1;
          local_1b4 = 0xfffd;
        }
        if ((local_1b8 != 1) || (local_1b4 != 0xfffd)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,ep,
                 (long)local_1b8);
          ep = ep + local_1b8;
          goto LAB_0033f2fa;
        }
      }
      if (ep < pcVar6) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,ep
                   ,1);
      }
      ep = ep + 1;
      goto LAB_0033f2fa;
    }
    Rewrite(re,(string *)local_178,(StringPiece *)vec[0x10].size_,(StringPiece *)local_138,iVar2);
    pcVar8 = StringPiece::data((StringPiece *)local_138);
    sVar10 = StringPiece::size((StringPiece *)local_138);
    out.field_2._8_8_ = pcVar8 + sVar10;
    local_17c = local_17c + 1;
    ep = (char *)out.field_2._8_8_;
  } while( true );
}

Assistant:

int RE2::GlobalReplace(std::string* str,
                       const RE2& re,
                       const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  std::string out;
  int count = 0;
  while (p <= ep) {
    if (maximum_global_replace_count != -1 &&
        count >= maximum_global_replace_count)
      break;
    if (!re.Match(*str, static_cast<size_t>(p - str->data()),
                  str->size(), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].data())
      out.append(p, vec[0].data() - p);
    if (vec[0].data() == lastend && vec[0].empty()) {
      // Disallow empty match at end of last match: skip ahead.
      //
      // fullrune() takes int, not ptrdiff_t. However, it just looks
      // at the leading byte and treats any length >= 4 the same.
      if (re.options().encoding() == RE2::Options::EncodingUTF8 &&
          fullrune(p, static_cast<int>(std::min(ptrdiff_t{4}, ep - p)))) {
        // re is in UTF-8 mode and there is enough left of str
        // to allow us to advance by up to UTFmax bytes.
        Rune r;
        int n = chartorune(&r, p);
        // Some copies of chartorune have a bug that accepts
        // encodings of values in (10FFFF, 1FFFFF] as valid.
        if (r > Runemax) {
          n = 1;
          r = Runeerror;
        }
        if (!(n == 1 && r == Runeerror)) {  // no decoding error
          out.append(p, n);
          p += n;
          continue;
        }
      }
      // Most likely, re is in Latin-1 mode. If it is in UTF-8 mode,
      // we fell through from above and the GIGO principle applies.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].data() + vec[0].size();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  using std::swap;
  swap(out, *str);
  return count;
}